

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-configure.c
# Opt level: O2

int run_test_loop_configure(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_3f0;
  uv_timer_t timer_handle;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    iVar1 = uv_loop_configure(&loop,UV_LOOP_BLOCK_SIGNAL,0x1b);
    if (iVar1 == 0) {
      iVar1 = uv_timer_init(&loop,&timer_handle);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer_handle,timer_cb,10,0);
        if (iVar1 == 0) {
          iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
          if (iVar1 == 0) {
            iVar1 = uv_loop_close(&loop);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar2 = "0 == uv_loop_close(&loop)";
            uStack_3f0 = 0x24;
          }
          else {
            pcVar2 = "0 == uv_run(&loop, UV_RUN_DEFAULT)";
            uStack_3f0 = 0x23;
          }
        }
        else {
          pcVar2 = "0 == uv_timer_start(&timer_handle, timer_cb, 10, 0)";
          uStack_3f0 = 0x22;
        }
      }
      else {
        pcVar2 = "0 == uv_timer_init(&loop, &timer_handle)";
        uStack_3f0 = 0x21;
      }
    }
    else {
      pcVar2 = "0 == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, SIGPROF)";
      uStack_3f0 = 0x1f;
    }
  }
  else {
    pcVar2 = "0 == uv_loop_init(&loop)";
    uStack_3f0 = 0x1b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-configure.c"
          ,uStack_3f0,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(loop_configure) {
  uv_timer_t timer_handle;
  uv_loop_t loop;
  ASSERT(0 == uv_loop_init(&loop));
#ifdef _WIN32
  ASSERT(UV_ENOSYS == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, 0));
#else
  ASSERT(0 == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, SIGPROF));
#endif
  ASSERT(0 == uv_timer_init(&loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT(0 == uv_loop_close(&loop));
  return 0;
}